

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_char(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  luaL_Buffer b;
  luaL_Buffer local_2050;
  
  iVar1 = lua_gettop(L);
  pcVar2 = luaL_buffinitsize(L,&local_2050,(long)iVar1);
  if (0 < iVar1) {
    uVar4 = 1;
    do {
      uVar3 = luaL_checkinteger(L,(int)uVar4);
      if (0xff < uVar3) {
        luaL_argerror(L,(int)uVar4,"value out of range");
      }
      pcVar2[uVar4 - 1] = (char)uVar3;
      uVar4 = uVar4 + 1;
    } while (iVar1 + 1 != uVar4);
  }
  luaL_pushresultsize(&local_2050,(long)iVar1);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  char *p = luaL_buffinitsize(L, &b, n);
  for (i=1; i<=n; i++) {
    lua_Integer c = luaL_checkinteger(L, i);
    luaL_argcheck(L, uchar(c) == c, i, "value out of range");
    p[i - 1] = uchar(c);
  }
  luaL_pushresultsize(&b, n);
  return 1;
}